

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O2

void __thiscall Assimp::ColladaParser::ReadGeometry(ColladaParser *this,Mesh *pMesh)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  allocator local_39;
  string local_38;
  
  iVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xf])();
  if ((char)iVar2 == '\0') {
    do {
      while( true ) {
        iVar2 = (*this->mReader->_vptr_IIrrXMLReader[2])();
        if ((char)iVar2 == '\0') {
          return;
        }
        iVar2 = (*this->mReader->_vptr_IIrrXMLReader[3])();
        if (iVar2 != 1) break;
        bVar1 = IsElement(this,"mesh");
        if (bVar1) {
          ReadMesh(this,pMesh);
        }
        else {
          SkipElement(this);
        }
      }
      iVar2 = (*this->mReader->_vptr_IIrrXMLReader[3])();
    } while (iVar2 != 2);
    iVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
    iVar2 = strcmp((char *)CONCAT44(extraout_var,iVar2),"geometry");
    if (iVar2 != 0) {
      std::__cxx11::string::string
                ((string *)&local_38,"Expected end of <geometry> element.",&local_39);
      ThrowException(this,&local_38);
    }
  }
  return;
}

Assistant:

void ColladaParser::ReadGeometry(Collada::Mesh* pMesh)
{
    if (mReader->isEmptyElement())
        return;

    while (mReader->read())
    {
        if (mReader->getNodeType() == irr::io::EXN_ELEMENT)
        {
            if (IsElement("mesh"))
            {
                // read on from there
                ReadMesh(pMesh);
            }
            else
            {
                // ignore the rest
                SkipElement();
            }
        }
        else if (mReader->getNodeType() == irr::io::EXN_ELEMENT_END)
        {
            if (strcmp(mReader->getNodeName(), "geometry") != 0)
                ThrowException("Expected end of <geometry> element.");

            break;
        }
    }
}